

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionManager.cpp
# Opt level: O0

void __thiscall OpenMD::SelectionManager::SelectionManager(SelectionManager *this,SimInfo *info)

{
  int iVar1;
  reference ppMVar2;
  reference ppSVar3;
  reference ppBVar4;
  reference ppBVar5;
  reference ppTVar6;
  reference ppIVar7;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  Inversion *inversion;
  Torsion *torsion;
  Bend *bend;
  Bond *bond;
  RigidBody *rb;
  Atom *atom;
  Molecule *mol;
  InversionIterator inversionIter;
  TorsionIterator torsionIter;
  BendIterator bendIter;
  BondIterator bondIter;
  RigidBodyIterator rbIter;
  AtomIterator ai;
  MoleculeIterator mi;
  value_type_conflict2 *in_stack_fffffffffffffd38;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffd40;
  SelectionSet *in_stack_fffffffffffffd50;
  vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_> *in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd60;
  int in_stack_fffffffffffffd64;
  undefined4 in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd8c;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffd90;
  Inversion *local_c0;
  Torsion *local_b8;
  Bend *local_b0;
  Bond *local_a8;
  RigidBody *local_a0;
  Atom *local_98;
  Molecule *local_90;
  __normal_iterator<OpenMD::Inversion_**,_std::vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>_>
  local_88;
  __normal_iterator<OpenMD::Torsion_**,_std::vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>_>
  local_80;
  __normal_iterator<OpenMD::Bend_**,_std::vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>_>
  local_78;
  __normal_iterator<OpenMD::Bond_**,_std::vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>_>
  local_70;
  __normal_iterator<OpenMD::RigidBody_**,_std::vector<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>_>
  local_68;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  local_60;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_58 [4];
  int local_38;
  uint local_34;
  uint local_30;
  uint local_2c;
  uint local_28;
  int local_14;
  
  *in_RDI = in_RSI;
  SelectionSet::SelectionSet(in_stack_fffffffffffffd50);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x378157);
  std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::vector
            ((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *)0x378170);
  std::vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>::vector
            ((vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_> *)0x378189);
  std::vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>::vector
            ((vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_> *)0x3781a2);
  std::vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>::vector
            ((vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_> *)0x3781bb);
  std::vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>::vector
            ((vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_> *)0x3781d7);
  std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>::vector
            ((vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_> *)0x3781f3);
  iVar1 = SimInfo::getNGlobalAtoms((SimInfo *)*in_RDI);
  local_14 = SimInfo::getNGlobalRigidBodies((SimInfo *)*in_RDI);
  local_14 = iVar1 + local_14;
  std::vector<int,_std::allocator<int>_>::push_back
            (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  local_28 = SimInfo::getNGlobalBonds((SimInfo *)*in_RDI);
  std::vector<int,_std::allocator<int>_>::push_back
            (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  local_2c = SimInfo::getNGlobalBends((SimInfo *)*in_RDI);
  std::vector<int,_std::allocator<int>_>::push_back
            (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  local_30 = SimInfo::getNGlobalTorsions((SimInfo *)*in_RDI);
  std::vector<int,_std::allocator<int>_>::push_back
            (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  local_34 = SimInfo::getNGlobalInversions((SimInfo *)*in_RDI);
  std::vector<int,_std::allocator<int>_>::push_back
            (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  local_38 = SimInfo::getNGlobalMolecules((SimInfo *)*in_RDI);
  std::vector<int,_std::allocator<int>_>::push_back
            (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  std::vector<int,_std::allocator<int>_>::operator[]
            ((vector<int,_std::allocator<int>_> *)(in_RDI + 4),0);
  std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::resize
            ((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *)
             CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
             (size_type)in_stack_fffffffffffffd58);
  std::vector<int,_std::allocator<int>_>::operator[]
            ((vector<int,_std::allocator<int>_> *)(in_RDI + 4),1);
  std::vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>::resize
            ((vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_> *)
             CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
             (size_type)in_stack_fffffffffffffd58);
  std::vector<int,_std::allocator<int>_>::operator[]
            ((vector<int,_std::allocator<int>_> *)(in_RDI + 4),2);
  std::vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>::resize
            ((vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_> *)
             CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
             (size_type)in_stack_fffffffffffffd58);
  std::vector<int,_std::allocator<int>_>::operator[]
            ((vector<int,_std::allocator<int>_> *)(in_RDI + 4),3);
  std::vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>::resize
            ((vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_> *)
             CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
             (size_type)in_stack_fffffffffffffd58);
  std::vector<int,_std::allocator<int>_>::operator[]
            ((vector<int,_std::allocator<int>_> *)(in_RDI + 4),4);
  std::vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>::resize
            ((vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_> *)
             CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
             (size_type)in_stack_fffffffffffffd58);
  std::vector<int,_std::allocator<int>_>::operator[]
            ((vector<int,_std::allocator<int>_> *)(in_RDI + 4),5);
  std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>::resize
            ((vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_> *)
             CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
             (size_type)in_stack_fffffffffffffd58);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_fffffffffffffd90,
             (vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
  SelectionSet::resize
            ((SelectionSet *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
             (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd58);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd50);
  std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(local_58);
  __gnu_cxx::
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  ::__normal_iterator(&local_60);
  __gnu_cxx::
  __normal_iterator<OpenMD::RigidBody_**,_std::vector<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>_>
  ::__normal_iterator(&local_68);
  __gnu_cxx::
  __normal_iterator<OpenMD::Bond_**,_std::vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>_>
  ::__normal_iterator(&local_70);
  __gnu_cxx::
  __normal_iterator<OpenMD::Bend_**,_std::vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>_>
  ::__normal_iterator(&local_78);
  __gnu_cxx::
  __normal_iterator<OpenMD::Torsion_**,_std::vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>_>
  ::__normal_iterator(&local_80);
  __gnu_cxx::
  __normal_iterator<OpenMD::Inversion_**,_std::vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>_>
  ::__normal_iterator(&local_88);
  local_90 = SimInfo::beginMolecule
                       ((SimInfo *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                        (MoleculeIterator *)in_stack_fffffffffffffd58);
  while (local_90 != (Molecule *)0x0) {
    iVar1 = Molecule::getGlobalIndex(local_90);
    ppMVar2 = std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>::operator[]
                        ((vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_> *)
                         (in_RDI + 0x16),(long)iVar1);
    *ppMVar2 = local_90;
    local_98 = Molecule::beginAtom((Molecule *)
                                   CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                                   (iterator *)in_stack_fffffffffffffd58);
    while (local_98 != (Atom *)0x0) {
      iVar1 = StuntDouble::getGlobalIndex(&local_98->super_StuntDouble);
      ppSVar3 = std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::
                operator[]((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *)
                           (in_RDI + 7),(long)iVar1);
      *ppSVar3 = &local_98->super_StuntDouble;
      local_98 = Molecule::nextAtom((Molecule *)
                                    CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                                    (iterator *)in_stack_fffffffffffffd58);
    }
    local_a0 = Molecule::beginRigidBody
                         ((Molecule *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                          (iterator *)in_stack_fffffffffffffd58);
    while (local_a0 != (RigidBody *)0x0) {
      iVar1 = StuntDouble::getGlobalIndex(&local_a0->super_StuntDouble);
      ppSVar3 = std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::
                operator[]((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *)
                           (in_RDI + 7),(long)iVar1);
      *ppSVar3 = &local_a0->super_StuntDouble;
      local_a0 = Molecule::nextRigidBody
                           ((Molecule *)
                            CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                            (iterator *)in_stack_fffffffffffffd58);
    }
    local_a8 = Molecule::beginBond((Molecule *)
                                   CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                                   (iterator *)in_stack_fffffffffffffd58);
    while (local_a8 != (Bond *)0x0) {
      iVar1 = ShortRangeInteraction::getGlobalIndex(&local_a8->super_ShortRangeInteraction);
      ppBVar4 = std::vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>::operator[]
                          ((vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_> *)(in_RDI + 10),
                           (long)iVar1);
      *ppBVar4 = local_a8;
      local_a8 = Molecule::nextBond((Molecule *)
                                    CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                                    (iterator *)in_stack_fffffffffffffd58);
    }
    local_b0 = Molecule::beginBend((Molecule *)
                                   CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                                   (iterator *)in_stack_fffffffffffffd58);
    while (local_b0 != (Bend *)0x0) {
      iVar1 = ShortRangeInteraction::getGlobalIndex(&local_b0->super_ShortRangeInteraction);
      ppBVar5 = std::vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>::operator[]
                          ((vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_> *)(in_RDI + 0xd)
                           ,(long)iVar1);
      *ppBVar5 = local_b0;
      local_b0 = Molecule::nextBend((Molecule *)
                                    CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                                    (iterator *)in_stack_fffffffffffffd58);
    }
    local_b8 = Molecule::beginTorsion
                         ((Molecule *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                          (iterator *)in_stack_fffffffffffffd58);
    while (local_b8 != (Torsion *)0x0) {
      iVar1 = ShortRangeInteraction::getGlobalIndex(&local_b8->super_ShortRangeInteraction);
      ppTVar6 = std::vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>::operator[]
                          ((vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_> *)
                           (in_RDI + 0x10),(long)iVar1);
      *ppTVar6 = local_b8;
      local_b8 = Molecule::nextTorsion
                           ((Molecule *)
                            CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                            (iterator *)in_stack_fffffffffffffd58);
    }
    local_c0 = Molecule::beginInversion
                         ((Molecule *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                          (iterator *)in_stack_fffffffffffffd58);
    while (local_c0 != (Inversion *)0x0) {
      in_stack_fffffffffffffd58 =
           (vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_> *)(in_RDI + 0x13);
      in_stack_fffffffffffffd64 =
           ShortRangeInteraction::getGlobalIndex(&local_c0->super_ShortRangeInteraction);
      ppIVar7 = std::vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>::operator[]
                          (in_stack_fffffffffffffd58,(long)in_stack_fffffffffffffd64);
      *ppIVar7 = local_c0;
      local_c0 = Molecule::nextInversion
                           ((Molecule *)
                            CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                            (iterator *)in_stack_fffffffffffffd58);
    }
    local_90 = SimInfo::nextMolecule
                         ((SimInfo *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                          (MoleculeIterator *)in_stack_fffffffffffffd58);
  }
  return;
}

Assistant:

SelectionManager::SelectionManager(SimInfo* info) : info_(info) {
    nObjects_.push_back(info_->getNGlobalAtoms() +
                        info_->getNGlobalRigidBodies());
    nObjects_.push_back(info_->getNGlobalBonds());
    nObjects_.push_back(info_->getNGlobalBends());
    nObjects_.push_back(info_->getNGlobalTorsions());
    nObjects_.push_back(info_->getNGlobalInversions());
    nObjects_.push_back(info_->getNGlobalMolecules());

    stuntdoubles_.resize(nObjects_[STUNTDOUBLE]);
    bonds_.resize(nObjects_[BOND]);
    bends_.resize(nObjects_[BEND]);
    torsions_.resize(nObjects_[TORSION]);
    inversions_.resize(nObjects_[INVERSION]);
    molecules_.resize(nObjects_[MOLECULE]);

    ss_.resize(nObjects_);

    SimInfo::MoleculeIterator mi;
    Molecule::AtomIterator ai;
    Molecule::RigidBodyIterator rbIter;
    Molecule::BondIterator bondIter;
    Molecule::BendIterator bendIter;
    Molecule::TorsionIterator torsionIter;
    Molecule::InversionIterator inversionIter;

    Molecule* mol;
    Atom* atom;
    RigidBody* rb;
    Bond* bond;
    Bend* bend;
    Torsion* torsion;
    Inversion* inversion;

    for (mol = info_->beginMolecule(mi); mol != NULL;
         mol = info_->nextMolecule(mi)) {
      molecules_[mol->getGlobalIndex()] = mol;

      for (atom = mol->beginAtom(ai); atom != NULL; atom = mol->nextAtom(ai)) {
        stuntdoubles_[atom->getGlobalIndex()] = atom;
      }
      for (rb = mol->beginRigidBody(rbIter); rb != NULL;
           rb = mol->nextRigidBody(rbIter)) {
        stuntdoubles_[rb->getGlobalIndex()] = rb;
      }
      for (bond = mol->beginBond(bondIter); bond != NULL;
           bond = mol->nextBond(bondIter)) {
        bonds_[bond->getGlobalIndex()] = bond;
      }
      for (bend = mol->beginBend(bendIter); bend != NULL;
           bend = mol->nextBend(bendIter)) {
        bends_[bend->getGlobalIndex()] = bend;
      }
      for (torsion = mol->beginTorsion(torsionIter); torsion != NULL;
           torsion = mol->nextTorsion(torsionIter)) {
        torsions_[torsion->getGlobalIndex()] = torsion;
      }
      for (inversion = mol->beginInversion(inversionIter); inversion != NULL;
           inversion = mol->nextInversion(inversionIter)) {
        inversions_[inversion->getGlobalIndex()] = inversion;
      }
    }
  }